

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O3

Variant * __thiscall
Rml::DataExpressionInterface::GetValue
          (Variant *__return_storage_ptr__,DataExpressionInterface *this,DataAddress *address)

{
  pointer pDVar1;
  int iVar2;
  flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
  *this_00;
  const_iterator cVar3;
  
  Variant::Variant(__return_storage_ptr__);
  if (((this->event != (Event *)0x0) &&
      (pDVar1 = (address->
                super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
                _M_impl.super__Vector_impl_data._M_start,
      (long)(address->
            super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
            _M_impl.super__Vector_impl_data._M_finish - (long)pDVar1 == 0x50)) &&
     (iVar2 = ::std::__cxx11::string::compare((char *)pDVar1), iVar2 == 0)) {
    this_00 = (flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
               *)Event::GetParameters_abi_cxx11_(this->event);
    cVar3 = itlib::
            flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
            ::find<std::__cxx11::string>
                      (this_00,&(address->
                                super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                                )._M_impl.super__Vector_impl_data._M_finish[-1].name);
    if (cVar3._M_current ==
        *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
          **)(this_00 + 8)) {
      return __return_storage_ptr__;
    }
    Variant::operator=(__return_storage_ptr__,&(cVar3._M_current)->second);
    return __return_storage_ptr__;
  }
  if (this->data_model != (DataModel *)0x0) {
    DataModel::GetVariableInto(this->data_model,address,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Variant DataExpressionInterface::GetValue(const DataAddress& address) const
{
	Variant result;
	if (event && address.size() == 2 && address.front().name == "ev")
	{
		auto& parameters = event->GetParameters();
		auto it = parameters.find(address.back().name);
		if (it != parameters.end())
			result = it->second;
	}
	else if (data_model)
	{
		data_model->GetVariableInto(address, result);
	}
	return result;
}